

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O2

Chunk * __thiscall SubBoard::accessChunk(SubBoard *this,repr coords)

{
  _Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false> _Var1;
  ChunkDrawable *this_00;
  pair<int,_int> *in_RCX;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>,_bool>
  pVar2;
  format_string_t<std::pair<int,_int>_> fmt;
  repr coords_local;
  LodRenderer *local_40;
  undefined1 *local_38;
  LodRenderer **local_30;
  undefined1 *local_28;
  
  coords_local = coords;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->chunks_)._M_h,&coords_local);
  if (_Var1._M_cur == (__node_type *)0x0) {
    local_38 = (undefined1 *)(coords_local ^ 0x8000000080000000);
    fmt.str.size_ = (size_t)&local_38;
    fmt.str.data_ = (char *)0x24;
    spdlog::warn<std::pair<int,int>>((spdlog *)"SubBoard allocating new chunk at {}.",fmt,in_RCX);
    local_40 = &this->super_LodRenderer;
    local_30 = &local_40;
    local_38 = (undefined1 *)&coords_local;
    local_28 = (undefined1 *)&coords_local;
    pVar2 = std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<LodRenderer*&&,unsigned_long&>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->chunks_,&std::piecewise_construct,&local_28,&local_38);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur;
    this_00 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
                        (&this->chunkDrawables_,&coords_local);
    ChunkDrawable::setChunk(this_00,(Chunk *)((long)_Var1._M_cur + 0x10));
  }
  return (Chunk *)((long)&((_Var1._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_Chunk>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_Chunk>_>.
                          _M_storage._M_storage + 8);
}

Assistant:

Chunk& SubBoard::accessChunk(ChunkCoords::repr coords) {
    auto chunk = chunks_.find(coords);
    if (chunk != chunks_.end()) {
        return chunk->second;
    }

    spdlog::warn("SubBoard allocating new chunk at {}.", ChunkCoords::toPair(coords));
    chunk = chunks_.emplace(std::piecewise_construct, std::forward_as_tuple(coords), std::forward_as_tuple(static_cast<LodRenderer*>(this), coords)).first;
    chunkDrawables_[coords].setChunk(&chunk->second);
    return chunk->second;
}